

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::calculateJacobi
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btConstraintInfo2 *info,int srow,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  float fVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  bool bVar4;
  btScalar abVar5 [4];
  long lVar6;
  long lVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar8;
  undefined4 uVar9;
  btVector3 bVar10;
  btScalar local_98 [4];
  btScalar local_88 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  btVector3 local_50;
  btVector3 local_40;
  
  bVar4 = rotational != 0;
  pbVar2 = (&info->m_J1linearAxis)[bVar4];
  pbVar3 = (&info->m_J2linearAxis)[bVar4];
  lVar7 = (long)srow;
  pbVar2[lVar7] = ax1->m_floats[0];
  pbVar2[lVar7 + 1] = ax1->m_floats[1];
  pbVar2[lVar7 + 2] = ax1->m_floats[2];
  uVar8 = 0x80000000;
  uVar9 = 0x80000000;
  pbVar3[lVar7] = -ax1->m_floats[0];
  pbVar3[lVar7 + 1] = -ax1->m_floats[1];
  pbVar3[lVar7 + 2] = -ax1->m_floats[2];
  if (rotational == 0) {
    local_50 = operator-(&(this->m_calculatedTransformB).m_origin,&transB->m_origin);
    local_40 = operator-(&(this->m_calculatedTransformA).m_origin,&transA->m_origin);
    local_88 = (btScalar  [4])btVector3::cross(&local_40,ax1);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_8_ = local_88._0_8_;
    local_78._12_4_ = extraout_XMM0_Dd;
    local_68._8_4_ = uVar8;
    local_68._0_8_ = local_88._8_8_;
    local_68._12_4_ = uVar9;
    bVar10 = btVector3::cross(&local_50,ax1);
    abVar5 = local_88;
    local_98[0] = bVar10.m_floats[0];
    local_98[1] = bVar10.m_floats[1];
    local_98[2] = bVar10.m_floats[2];
    local_98[3] = bVar10.m_floats[3];
    if ((rotAllowed == 0) && (this->m_hasStaticBody != false)) {
      fVar1 = this->m_factA;
      local_88[1] = fVar1 * (float)local_78._4_4_;
      local_88[0] = fVar1 * (float)local_78._0_4_;
      local_88[3] = abVar5[3];
      local_88[2] = (float)local_68._0_4_ * fVar1;
      fVar1 = this->m_factB;
      local_98[1] = fVar1 * bVar10.m_floats[1];
      local_98[0] = fVar1 * bVar10.m_floats[0];
      local_98[3] = bVar10.m_floats[3];
      local_98[2] = bVar10.m_floats[2] * fVar1;
    }
    pbVar2 = info->m_J1angularAxis;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      pbVar2[lVar7 + lVar6] = local_88[lVar6];
    }
    pbVar2 = info->m_J2angularAxis;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      pbVar2[lVar7 + lVar6] = -local_98[lVar6];
    }
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateJacobi(btRotationalLimitMotor2 * limot, const btTransform& transA,const btTransform& transB, btConstraintInfo2 *info, int srow, btVector3& ax1, int rotational, int rotAllowed)
{
	btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
	btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;

	J1[srow+0] = ax1[0];
	J1[srow+1] = ax1[1];
	J1[srow+2] = ax1[2];

	J2[srow+0] = -ax1[0];
	J2[srow+1] = -ax1[1];
	J2[srow+2] = -ax1[2];

	if(!rotational)
	{
		btVector3 tmpA, tmpB, relA, relB;
		// get vector from bodyB to frameB in WCS
		relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
		// same for bodyA
		relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
		tmpA = relA.cross(ax1);
		tmpB = relB.cross(ax1);
		if(m_hasStaticBody && (!rotAllowed))
		{
			tmpA *= m_factA;
			tmpB *= m_factB;
		}
		int i;
		for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
	}
}